

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O0

void __thiscall
MDIOAnalyzerResults::GenBubbleText
          (MDIOAnalyzerResults *this,U64 frame_index,DisplayBase display_base,bool tabular)

{
  Frame local_48 [8];
  Frame frame;
  undefined1 local_28;
  bool tabular_local;
  DisplayBase display_base_local;
  U64 frame_index_local;
  MDIOAnalyzerResults *this_local;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_48);
  switch(local_28) {
  case 0:
    GenStartString(this,local_48,"22",tabular);
    break;
  case 1:
    GenStartString(this,local_48,"45",tabular);
    break;
  case 2:
    GenOpString(this,local_48,"W","WR","Write",tabular);
    break;
  case 3:
    GenOpString(this,local_48,"R","RD","Read",tabular);
    break;
  case 4:
    GenOpString(this,local_48,"A","AD","Address",tabular);
    break;
  case 5:
    GenOpString(this,local_48,"R+A","RD +AD","Read-Increment-Address",tabular);
    break;
  case 6:
    GenPhyAddrString(this,local_48,display_base,tabular);
    break;
  case 7:
    GenC22RegAddrString(this,local_48,display_base,tabular);
    break;
  case 8:
    GenC45DevTypeString(this,local_48,display_base,"Reserved",tabular);
    break;
  case 9:
    GenC45DevTypeString(this,local_48,display_base,"PMD/PMA",tabular);
    break;
  case 10:
    GenC45DevTypeString(this,local_48,display_base,"WIS",tabular);
    break;
  case 0xb:
    GenC45DevTypeString(this,local_48,display_base,"PCS",tabular);
    break;
  case 0xc:
    GenC45DevTypeString(this,local_48,display_base,"PHY XS",tabular);
    break;
  case 0xd:
    GenC45DevTypeString(this,local_48,display_base,"DTE XS",tabular);
    break;
  case 0xe:
    GenC45DevTypeString(this,local_48,display_base,"Other",tabular);
    break;
  case 0xf:
    GenTAString(this,local_48,display_base,tabular);
    break;
  case 0x10:
    GenC22DataString(this,local_48,display_base,tabular);
    break;
  case 0x11:
    GenC45AddrDataString(this,local_48,display_base,"A","ADDR","Address",tabular);
    break;
  case 0x12:
    GenC45AddrDataString(this,local_48,display_base,"D","DATA","Data",tabular);
    break;
  case 0x13:
    GenUnknownString(this,tabular);
  }
  Frame::~Frame(local_48);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenBubbleText( U64 frame_index, DisplayBase display_base, bool tabular )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    switch( frame.mType )
    {
    case MDIO_C22_START:
        GenStartString( frame, "22", tabular );
        break;
    case MDIO_C45_START:
        GenStartString( frame, "45", tabular );
        break;
    case MDIO_OP_W:
        GenOpString( frame, "W", "WR", "Write", tabular );
        break;
    case MDIO_OP_R:
        GenOpString( frame, "R", "RD", "Read", tabular );
        break;
    case MDIO_C45_OP_ADDR:
        GenOpString( frame, "A", "AD", "Address", tabular );
        break;
    case MDIO_C45_OP_READ_INC_ADDR:
        GenOpString( frame, "R+A", "RD +AD", "Read-Increment-Address", tabular );
        break;
    case MDIO_PHYADDR:
        GenPhyAddrString( frame, display_base, tabular );
        break;
    case MDIO_C22_REGADDR:
        GenC22RegAddrString( frame, display_base, tabular );
        break;
    case MDIO_C45_DEVTYPE_RESERVED:
        GenC45DevTypeString( frame, display_base, "Reserved", tabular );
        break;
    case MDIO_C45_DEVTYPE_PMD_PMA:
        GenC45DevTypeString( frame, display_base, "PMD/PMA", tabular );
        break;
    case MDIO_C45_DEVTYPE_WIS:
        GenC45DevTypeString( frame, display_base, "WIS", tabular );
        break;
    case MDIO_C45_DEVTYPE_PCS:
        GenC45DevTypeString( frame, display_base, "PCS", tabular );
        break;
    case MDIO_C45_DEVTYPE_PHY_XS:
        GenC45DevTypeString( frame, display_base, "PHY XS", tabular );
        break;
    case MDIO_C45_DEVTYPE_DTE_XS:
        GenC45DevTypeString( frame, display_base, "DTE XS", tabular );
        break;
    case MDIO_C45_DEVTYPE_OTHER:
        GenC45DevTypeString( frame, display_base, "Other", tabular );
        break;
    case MDIO_TA:
        GenTAString( frame, display_base, tabular );
        break;
    case MDIO_C22_DATA:
        GenC22DataString( frame, display_base, tabular );
        break;
    case MDIO_C45_ADDR:
        GenC45AddrDataString( frame, display_base, "A", "ADDR", "Address", tabular );
        break;
    case MDIO_C45_DATA:
        GenC45AddrDataString( frame, display_base, "D", "DATA", "Data", tabular );
        break;
    case MDIO_UNKNOWN:
        GenUnknownString( tabular );
        break;
    }
}